

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O2

void __thiscall
cmDebugServerConsole::cmDebugServerConsole(cmDebugServerConsole *this,cmDebugger *debugger)

{
  cmConnection *conn;
  cmConnectionBufferStrategy *bufferStrategy;
  
  conn = (cmConnection *)operator_new(0x48);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(8);
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmConnectionBufferStrategy_00655eb8;
  cmStdIoConnection::cmStdIoConnection((cmStdIoConnection *)conn,bufferStrategy);
  cmDebugServerConsole(this,debugger,conn,true);
  return;
}

Assistant:

cmDebugServerConsole::cmDebugServerConsole(cmDebugger& debugger)
  : cmDebugServerConsole(debugger,
                         new cmStdIoConnection(new cmLineBufferStrategy()))
{
}